

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::Option::Option(Option *this,Option *param_1)

{
  Option *param_1_local;
  Option *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->desc_,(string *)&param_1->desc_);
  std::shared_ptr<const_cxxopts::Value>::shared_ptr(&this->value_,&param_1->value_);
  std::__cxx11::string::string((string *)&this->arg_help_,(string *)&param_1->arg_help_);
  return;
}

Assistant:

Option
    (
      std::string opts,
      std::string desc,
      std::shared_ptr<const Value>  value = ::cxxopts::value<bool>(),
      std::string arg_help = ""
    )
    : opts_(std::move(opts))
    , desc_(std::move(desc))
    , value_(std::move(value))
    , arg_help_(std::move(arg_help))
    {
    }